

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint128 CityMurmur(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  long lVar2;
  uint64 u;
  uint64 uVar3;
  uint64 local_88;
  uint64 local_70;
  ulong local_68;
  long local_60;
  long l;
  uint64 d;
  uint64 c;
  uint64 b;
  uint64 a;
  size_t len_local;
  char *s_local;
  uint128 seed_local;
  
  seed_local.first = seed.second;
  s_local = (char *)seed.first;
  a = len;
  len_local = (size_t)s;
  b = Uint128Low64((uint128 *)&s_local);
  c = Uint128High64((uint128 *)&s_local);
  d = 0;
  l = 0;
  local_60 = a - 0x10;
  if (local_60 < 1) {
    uVar1 = ShiftMix(b * -0x4b6d499041670d8d);
    b = uVar1 * -0x4b6d499041670d8d;
    lVar2 = c * -0x4b6d499041670d8d;
    local_88 = HashLen0to16((char *)len_local,a);
    uVar1 = b;
    local_88 = lVar2 + local_88;
    d = local_88;
    if (7 < a) {
      local_88 = Fetch64((char *)len_local);
    }
    l = ShiftMix(uVar1 + local_88);
  }
  else {
    uVar1 = Fetch64((char *)(len_local + a + -8));
    uVar1 = HashLen16(uVar1 + 0xb492b66fbe98f273,b);
    u = c + a;
    d = uVar1;
    uVar3 = Fetch64((char *)(len_local + a + -0x10));
    l = HashLen16(u,uVar1 + uVar3);
    b = l + b;
    do {
      uVar1 = Fetch64((char *)len_local);
      uVar1 = ShiftMix(uVar1 * -0x4b6d499041670d8d);
      b = (uVar1 * -0x4b6d499041670d8d ^ b) * -0x4b6d499041670d8d;
      c = b ^ c;
      uVar1 = Fetch64((char *)(len_local + 8));
      uVar1 = ShiftMix(uVar1 * -0x4b6d499041670d8d);
      d = (uVar1 * -0x4b6d499041670d8d ^ d) * -0x4b6d499041670d8d;
      l = d ^ l;
      len_local = len_local + 0x10;
      local_60 = local_60 + -0x10;
    } while (0 < local_60);
  }
  b = HashLen16(b,d);
  c = HashLen16(l,c);
  local_68 = b ^ c;
  local_70 = HashLen16(c,b);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)&seed_local.second,&local_68,&local_70);
  return stack0xffffffffffffffe8;
}

Assistant:

static uint128 CityMurmur(const char *s, size_t len, uint128 seed) {
  uint64 a = Uint128Low64(seed);
  uint64 b = Uint128High64(seed);
  uint64 c = 0;
  uint64 d = 0;
  signed long l = len - 16;
  if (l <= 0) {  // len <= 16
    a = ShiftMix(a * k1) * k1;
    c = b * k1 + HashLen0to16(s, len);
    d = ShiftMix(a + (len >= 8 ? Fetch64(s) : c));
  } else {  // len > 16
    c = HashLen16(Fetch64(s + len - 8) + k1, a);
    d = HashLen16(b + len, c + Fetch64(s + len - 16));
    a += d;
    do {
      a ^= ShiftMix(Fetch64(s) * k1) * k1;
      a *= k1;
      b ^= a;
      c ^= ShiftMix(Fetch64(s + 8) * k1) * k1;
      c *= k1;
      d ^= c;
      s += 16;
      l -= 16;
    } while (l > 0);
  }
  a = HashLen16(a, c);
  b = HashLen16(d, b);
  return uint128(a ^ b, HashLen16(b, a));
}